

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

void __thiscall
mp::internal::
NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<ExprPrinter>_>::Read
          (NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<ExprPrinter>_>
           *this,TextReader<fmt::Locale> *bound_reader)

{
  NLHeader *pNVar1;
  TextReader<fmt::Locale> *pTVar2;
  byte *loc;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  undefined8 uVar9;
  _Alloc_hider _Var10;
  bool bVar11;
  bool bVar12;
  NumericExpr expr;
  ArgList local_e8;
  undefined1 local_d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  long *local_b0 [2];
  long local_a0 [2];
  NumericExpr local_90;
  LogicalExpr local_70;
  NumericExpr local_50;
  
  bVar11 = bound_reader == (TextReader<fmt::Locale> *)0x0;
  pNVar1 = this->header_;
  this->num_vars_and_exprs_ =
       (pNVar1->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_single_objs +
       (pNVar1->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_objs +
       (pNVar1->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_single_cons +
       (pNVar1->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_cons +
       (pNVar1->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_both +
       (pNVar1->super_NLProblemInfo).super_NLProblemInfo_C.num_vars;
  do {
    pTVar2 = this->reader_;
    loc = (byte *)(pTVar2->super_ReaderBase).ptr_;
    (pTVar2->super_ReaderBase).token_ = (char *)loc;
    (pTVar2->super_ReaderBase).ptr_ = (char *)(loc + 1);
    bVar6 = *loc;
    if (0x61 < bVar6) {
      if (bVar6 < 0x6b) {
        if (bVar6 == 0x62) {
          if (bVar11 == false) {
            if (bound_reader == (TextReader<fmt::Locale> *)0x0) {
              local_d8 = (undefined1  [16])0x0;
              local_e8.types_ = 0;
              local_e8.field_1.values_ = (Value *)local_d8;
              TextReader<fmt::Locale>::DoReportError
                        (pTVar2,(char *)loc,(CStringRef)0x139e71,&local_e8);
            }
            pTVar2 = this->reader_;
            pcVar3 = (bound_reader->super_ReaderBase).ptr_;
            pcVar4 = (bound_reader->super_ReaderBase).start_;
            pcVar5 = (bound_reader->super_ReaderBase).token_;
            (pTVar2->super_ReaderBase).end_ = (bound_reader->super_ReaderBase).end_;
            (pTVar2->super_ReaderBase).token_ = pcVar5;
            (pTVar2->super_ReaderBase).ptr_ = pcVar3;
            (pTVar2->super_ReaderBase).start_ = pcVar4;
            std::__cxx11::string::_M_assign((string *)&(pTVar2->super_ReaderBase).name_);
            pTVar2->line_ = bound_reader->line_;
            pTVar2->line_start_ = bound_reader->line_start_;
            bVar12 = true;
            bound_reader = (TextReader<fmt::Locale> *)0x0;
          }
          else {
            NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<ExprPrinter>>
            ::
            ReadBounds<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<ExprPrinter>>::VarHandler>
                      ((NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<ExprPrinter>>
                        *)this);
            bVar6 = (byte)this->flags_ & 1;
            bVar12 = bVar6 == 0;
            bVar11 = (bool)(bVar11 & -bVar6);
          }
          goto LAB_0011bb97;
        }
        if (bVar6 != 100) goto switchD_0011b739_caseD_44;
        NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<ExprPrinter>>::
        ReadInitialValues<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<ExprPrinter>>::AlgebraicConHandler>
                  ((NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<ExprPrinter>>
                    *)this);
      }
      else if (bVar6 == 0x6b) {
        ReadColumnSizes<true>(this);
      }
      else if (bVar6 == 0x72) {
        NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<ExprPrinter>>::
        ReadBounds<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<ExprPrinter>>::AlgebraicConHandler>
                  ((NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<ExprPrinter>>
                    *)this);
      }
      else {
        if (bVar6 != 0x78) goto switchD_0011b739_caseD_44;
        NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<ExprPrinter>>::
        ReadInitialValues<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<ExprPrinter>>::VarHandler>
                  ((NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<ExprPrinter>>
                    *)this);
      }
      goto LAB_0011bb94;
    }
    switch(bVar6) {
    case 0x43:
      ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_algebraic_cons);
      TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
      pTVar2 = this->reader_;
      pcVar3 = (pTVar2->super_ReaderBase).ptr_;
      (pTVar2->super_ReaderBase).token_ = pcVar3;
      (pTVar2->super_ReaderBase).ptr_ = pcVar3 + 1;
      NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<ExprPrinter>>::
      ReadNumericExpr_abi_cxx11_
                (&local_50,
                 (NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<ExprPrinter>>
                  *)this,*pcVar3,true);
      bVar12 = true;
      uVar9 = local_50.field_2._M_allocated_capacity;
      _Var10._M_p = local_50._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_0011ba7e:
        bVar12 = true;
        operator_delete(_Var10._M_p,uVar9 + 1);
      }
      goto LAB_0011bb97;
    case 0x44:
    case 0x45:
    case 0x48:
    case 0x49:
    case 0x4d:
    case 0x4e:
    case 0x50:
    case 0x51:
    case 0x52:
    case 0x54:
    case 0x55:
switchD_0011b739_caseD_44:
      local_d8 = (undefined1  [16])0x0;
      local_e8.types_ = 0;
      local_e8.field_1.values_ = (Value *)local_d8;
      TextReader<fmt::Locale>::DoReportError(pTVar2,(char *)loc,(CStringRef)0x139e9b,&local_e8);
      break;
    case 0x46:
      ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_funcs);
      uVar7 = TextReader<fmt::Locale>::ReadUInt<int>(this->reader_);
      if (1 < uVar7) {
        local_d8 = (undefined1  [16])0x0;
        local_e8.types_ = 0;
        local_e8.field_1.values_ = (Value *)local_d8;
        TextReader<fmt::Locale>::DoReportError
                  (this->reader_,(this->reader_->super_ReaderBase).token_,(CStringRef)0x139e47,
                   &local_e8);
      }
      TextReader<fmt::Locale>::ReadInt<int>(this->reader_);
      TextReader<fmt::Locale>::ReadName(this->reader_);
      TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
      break;
    case 0x47:
      NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<ExprPrinter>>::
      ReadLinearExpr<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<ExprPrinter>>::ObjHandler>
                ((NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<ExprPrinter>>
                  *)this);
      break;
    case 0x4a:
      NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<ExprPrinter>>::
      ReadLinearExpr<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<ExprPrinter>>::AlgebraicConHandler>
                ((NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<ExprPrinter>>
                  *)this);
      break;
    case 0x4b:
      ReadColumnSizes<false>(this);
      break;
    case 0x4c:
      ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_logical_cons);
      TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
      NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<ExprPrinter>>::
      ReadLogicalExpr_abi_cxx11_
                (&local_70,
                 (NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<ExprPrinter>>
                  *)this);
      bVar12 = true;
      uVar9 = local_70.field_2._M_allocated_capacity;
      _Var10._M_p = local_70._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) goto LAB_0011ba7e;
      goto LAB_0011bb97;
    case 0x4f:
      ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_objs);
      TextReader<fmt::Locale>::ReadUInt<int>(this->reader_);
      TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
      pTVar2 = this->reader_;
      pcVar3 = (pTVar2->super_ReaderBase).ptr_;
      (pTVar2->super_ReaderBase).token_ = pcVar3;
      (pTVar2->super_ReaderBase).ptr_ = pcVar3 + 1;
      NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<ExprPrinter>>::
      ReadNumericExpr_abi_cxx11_
                ((NumericExpr *)local_d8,
                 (NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<ExprPrinter>>
                  *)this,*pcVar3,true);
      local_b0[0] = local_a0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_b0,local_d8._0_8_,(pointer)(local_d8._0_8_ + local_d8._8_8_));
      if (local_b0[0] != local_a0) {
        operator_delete(local_b0[0],local_a0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._0_8_ != &local_c8) {
        operator_delete((void *)local_d8._0_8_,local_c8._M_allocated_capacity + 1);
      }
      break;
    case 0x53:
      uVar7 = TextReader<fmt::Locale>::ReadUInt<int>(pTVar2);
      if (7 < (int)uVar7) {
        local_d8 = (undefined1  [16])0x0;
        local_e8.types_ = 0;
        local_e8.field_1.values_ = (Value *)local_d8;
        TextReader<fmt::Locale>::DoReportError
                  (this->reader_,(this->reader_->super_ReaderBase).token_,(CStringRef)0x139e5d,
                   &local_e8);
      }
      switch(uVar7 & 3) {
      case 0:
        NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<ExprPrinter>>::
        ReadSuffix<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<ExprPrinter>>::VarHandler>
                  ((NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<ExprPrinter>>
                    *)this,uVar7);
        break;
      case 1:
        NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<ExprPrinter>>::
        ReadSuffix<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<ExprPrinter>>::ConHandler>
                  ((NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<ExprPrinter>>
                    *)this,uVar7);
        break;
      case 2:
        NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<ExprPrinter>>::
        ReadSuffix<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<ExprPrinter>>::ObjHandler>
                  ((NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<ExprPrinter>>
                    *)this,uVar7);
        break;
      case 3:
        NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<ExprPrinter>>::
        ReadSuffix<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<ExprPrinter>>::ProblemHandler>
                  ((NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<ExprPrinter>>
                    *)this,uVar7);
      }
      break;
    case 0x56:
      ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_vars,
               this->num_vars_and_exprs_);
      iVar8 = TextReader<fmt::Locale>::ReadUInt<int>(this->reader_);
      TextReader<fmt::Locale>::ReadUInt<int>(this->reader_);
      TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
      if (iVar8 != 0) {
        NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<ExprPrinter>>::
        ReadLinearExpr<mp::NLHandler<mp::NullNLHandler<std::__cxx11::string>,std::__cxx11::string>::LinearExprHandler>
                  ((NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<ExprPrinter>>
                    *)this,iVar8);
      }
      pTVar2 = this->reader_;
      pcVar3 = (pTVar2->super_ReaderBase).ptr_;
      (pTVar2->super_ReaderBase).token_ = pcVar3;
      (pTVar2->super_ReaderBase).ptr_ = pcVar3 + 1;
      NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<ExprPrinter>>::
      ReadNumericExpr_abi_cxx11_
                (&local_90,
                 (NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<ExprPrinter>>
                  *)this,*pcVar3,false);
      bVar12 = true;
      uVar9 = local_90.field_2._M_allocated_capacity;
      _Var10._M_p = local_90._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) goto LAB_0011ba7e;
      goto LAB_0011bb97;
    default:
      if ((bVar6 != 0) || ((byte *)(pTVar2->super_ReaderBase).end_ != loc))
      goto switchD_0011b739_caseD_44;
      if (bVar11 != false) {
        local_d8 = (undefined1  [16])0x0;
        local_e8.types_ = 0;
        local_e8.field_1.values_ = (Value *)local_d8;
        TextReader<fmt::Locale>::DoReportError(pTVar2,(char *)loc,(CStringRef)0x139e87,&local_e8);
      }
      bVar12 = false;
      goto LAB_0011bb97;
    }
LAB_0011bb94:
    bVar12 = true;
LAB_0011bb97:
    if (!bVar12) {
      return;
    }
  } while( true );
}

Assistant:

void NLReader<Reader, Handler>::Read(Reader *bound_reader) {
  bool read_bounds = bound_reader == 0;
  // TextReader::ReadHeader checks that this doesn't overflow.
  num_vars_and_exprs_ = header_.num_vars +
      header_.num_common_exprs_in_both +
      header_.num_common_exprs_in_cons +
      header_.num_common_exprs_in_objs +
      header_.num_common_exprs_in_single_cons +
      header_.num_common_exprs_in_single_objs;
  for (;;) {
    char c = reader_.ReadChar();
    switch (c) {
    case 'C': {
      // Nonlinear part of an algebraic constraint body.
      int index = ReadUInt(header_.num_algebraic_cons);
      reader_.ReadTillEndOfLine();
      handler_.OnAlgebraicCon(index, ReadNumericExpr(true));
      break;
    }
    case 'L': {
      // Logical constraint expression.
      int index = ReadUInt(header_.num_logical_cons);
      reader_.ReadTillEndOfLine();
      handler_.OnLogicalCon(index, ReadLogicalExpr());
      break;
    }
    case 'O': {
      // Objective type and nonlinear part of an objective expression.
      int index = ReadUInt(header_.num_objs);
      int obj_type = reader_.ReadUInt();
      reader_.ReadTillEndOfLine();
      NumericExpr expr = ReadNumericExpr(true);
      if (handler_.NeedObj(index))
        handler_.OnObj(handler_.resulting_obj_index(index),
                       obj_type != 0 ? obj::MAX : obj::MIN,
                       expr);
      break;
    }
    case 'V': {
      // Defined variable definition (must precede V, C, L, O segments
      // where used).
      int expr_index = ReadUInt(header_.num_vars, num_vars_and_exprs_);
      expr_index -= header_.num_vars;
      int num_linear_terms = reader_.ReadUInt();
      int position = reader_.ReadUInt();
      reader_.ReadTillEndOfLine();
      typename Handler::LinearExprHandler
          expr_handler(handler_.BeginCommonExpr(expr_index, num_linear_terms));
      if (num_linear_terms != 0)
        ReadLinearExpr(num_linear_terms, expr_handler);
      handler_.EndCommonExpr(expr_index, ReadNumericExpr(), position);
      break;
    }
    case 'F': {
      // Imported function description.
      int index = ReadUInt(header_.num_funcs);
      int type = reader_.ReadUInt();
      if (type != func::NUMERIC && type != func::SYMBOLIC)
        reader_.ReportError("invalid function type");
      int num_args = reader_.template ReadInt<int>();
      fmt::StringRef name = reader_.ReadName();
      reader_.ReadTillEndOfLine();
      handler_.OnFunction(index, name, num_args, static_cast<func::Type>(type));
      break;
    }
    case 'G':
      // Linear part of an objective expression & gradient sparsity.
      ReadLinearExpr<ObjHandler>();
      break;
    case 'J':
      // Jacobian sparsity & linear terms in constraints.
      ReadLinearExpr<AlgebraicConHandler>();
      break;
    case 'S': {
      // Suffix values.
      int info = reader_.ReadUInt();
      if (info > (internal::SUFFIX_KIND_MASK | suf::FLOAT))
        reader_.ReportError("invalid suffix kind");
      switch (info & internal::SUFFIX_KIND_MASK) {
      case suf::VAR:
        ReadSuffix<VarHandler>(info);
        break;
      case suf::CON:
        ReadSuffix<ConHandler>(info);
        break;
      case suf::OBJ:
        ReadSuffix<ObjHandler>(info);
        break;
      case suf::PROBLEM:
        ReadSuffix<ProblemHandler>(info);
        break;
      }
      break;
    }
    case 'b':
      // Bounds on variables.
      if (read_bounds) {
        ReadBounds<VarHandler>();
        reader_.ptr();
        if ((flags_ & READ_BOUNDS_FIRST) != 0)
          return;
        read_bounds = false;
        break;
      }
      if (!bound_reader)
        reader_.ReportError("duplicate 'b' segment");
      reader_ = *bound_reader;
      bound_reader = 0;
      break;
    case 'r':
      // Bounds on algebraic constraint bodies ("ranges").
      ReadBounds<AlgebraicConHandler>();
      break;
    case 'K':
      // Jacobian sparsity & linear constraint term matrix column sizes
      // (must precede all J segments).
      ReadColumnSizes<false>();
      break;
    case 'k':
      // Jacobian sparsity & linear constraint term matrix cumulative column
      // sizes (must precede all J segments).
      ReadColumnSizes<true>();
      break;
    case 'x':
      // Primal initial guess.
      ReadInitialValues<VarHandler>();
      break;
    case 'd':
      // Dual initial guess.
      ReadInitialValues<AlgebraicConHandler>();
      break;
    case '\0':
      if (reader_.IsEOF()) {
        if (read_bounds)
          reader_.ReportError("segment 'b' missing");
        return;
      }
      // Fall through.
    default:
      reader_.ReportError("invalid segment type");
    }
  }
}